

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * wallet::LabelFromValue_abi_cxx11_(UniValue *value)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  string *message;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *label;
  UniValue *in_stack_ffffffffffffff78;
  UniValue *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  if (LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_
                               );
    if (iVar3 != 0) {
      std::__cxx11::string::string(in_stack_ffffffffffffff90);
      __cxa_atexit(std::__cxx11::string::~string,
                   &LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_);
    }
  }
  bVar2 = UniValue::isNull(in_stack_ffffffffffffff78);
  if (bVar2) {
    std::__cxx11::string::string(in_RSI,in_stack_ffffffffffffffb8);
  }
  else {
    message = UniValue::get_str_abi_cxx11_(in_stack_ffffffffffffff80);
    bVar2 = std::operator==(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    if (bVar2) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_RSI,(allocator<char> *)message);
      JSONRPCError((int)((ulong)this >> 0x20),message);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_005e2136;
    }
    std::__cxx11::string::string(in_RSI,message);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
LAB_005e2136:
  __stack_chk_fail();
}

Assistant:

std::string LabelFromValue(const UniValue& value)
{
    static const std::string empty_string;
    if (value.isNull()) return empty_string;

    const std::string& label{value.get_str()};
    if (label == "*")
        throw JSONRPCError(RPC_WALLET_INVALID_LABEL_NAME, "Invalid label name");
    return label;
}